

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O0

void write_count(ostream *out,int max_count)

{
  ostream *poVar1;
  int in_ESI;
  ostream *in_RDI;
  int i_1;
  int i;
  int local_14;
  int local_10;
  
  poVar1 = std::operator<<(in_RDI,"\n/** Count the number of elements in the given __VA_ARGS__ */\n"
                          );
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  poVar1 = std::operator<<(poVar1,"COUNT(...) ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  poVar1 = std::operator<<(poVar1,"EXPAND(");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  std::operator<<(poVar1,"COUNT_I(__VA_ARGS__");
  for (local_10 = in_ESI; local_10 != 0; local_10 = local_10 + -1) {
    poVar1 = std::operator<<(in_RDI,',');
    std::ostream::operator<<((ostream *)poVar1,local_10);
  }
  poVar1 = std::operator<<(in_RDI,",x))\n");
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_");
  std::operator<<(poVar1,"COUNT_I(");
  for (local_14 = 0; local_14 < in_ESI + 1; local_14 = local_14 + 1) {
    poVar1 = std::operator<<(in_RDI,'a');
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_14);
    std::operator<<(poVar1,',');
  }
  poVar1 = std::operator<<(in_RDI,"...) a");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,in_ESI);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void write_count(std::ostream& out, int max_count)
{
  out << "\n/** Count the number of elements in the given __VA_ARGS__ */\n"
      << "#define " << prefix << "COUNT(...) " << prefix << "EXPAND(" << prefix << "COUNT_I(__VA_ARGS__";
  for (int i = max_count; i != 0; --i)
  {
    out << ',' << i;
  }
  out << ",x))\n"
      << "#define " << prefix << "COUNT_I(";
  for (int i = 0; i < max_count+1; ++i)
  {
    out << 'a' << i << ',';
  }
  out << "...) a" << max_count << "\n";
}